

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_compiler.c
# Opt level: O1

_Bool gravity_compiler_serialize_infile
                (gravity_compiler_t *compiler,gravity_closure_t *closure,char *path)

{
  json_t *json;
  
  if (closure != (gravity_closure_t *)0x0) {
    json = gravity_compiler_serialize(compiler,closure);
    if (json != (json_t *)0x0) {
      json_write_file(json,path);
      json_free(json);
    }
    return json != (json_t *)0x0;
  }
  return false;
}

Assistant:

bool gravity_compiler_serialize_infile (gravity_compiler_t *compiler, gravity_closure_t *closure, const char *path) {
    if (!closure) return false;
    json_t *json = gravity_compiler_serialize(compiler, closure);
    if (!json) return false;
    
    json_write_file(json, path);
    json_free(json);
    return true;
}